

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

bool __thiscall
cmdline::parser::option_with_value<bool>::set(option_with_value<bool> *this,string *value)

{
  int iVar1;
  
  iVar1 = (*(this->super_option_base)._vptr_option_base[0xc])();
  this->actual = SUB41(iVar1,0);
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value){
                        try
                        {
                            actual = read(value);
                            has = true;
                        }
                        catch(
                        const std::exception
                        &e){
                            return false;
                        }
                        return true;
                    }